

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

string * __thiscall
mocker::nasm::fmtDirective_abi_cxx11_
          (string *__return_storage_ptr__,nasm *this,shared_ptr<mocker::nasm::Directive> *directive)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  string *psVar2;
  element_type *this_02;
  string local_78;
  undefined1 local_58 [8];
  shared_ptr<mocker::nasm::Extern> p_2;
  shared_ptr<mocker::nasm::Global> p_1;
  undefined1 local_28 [8];
  shared_ptr<mocker::nasm::Default> p;
  shared_ptr<mocker::nasm::Directive> *directive_local;
  
  p.super___shared_ptr<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  dyc<mocker::nasm::Default,std::shared_ptr<mocker::nasm::Directive>const&>
            ((shared_ptr<mocker::nasm::Directive> *)local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::nasm::Default,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    psVar2 = Default::getMode_abi_cxx11_(this_00);
    std::operator+(__return_storage_ptr__,"default ",psVar2);
  }
  std::shared_ptr<mocker::nasm::Default>::~shared_ptr((shared_ptr<mocker::nasm::Default> *)local_28)
  ;
  if (!bVar1) {
    dyc<mocker::nasm::Global,std::shared_ptr<mocker::nasm::Directive>const&>
              ((shared_ptr<mocker::nasm::Directive> *)
               &p_2.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &p_2.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      this_01 = std::
                __shared_ptr_access<mocker::nasm::Global,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::nasm::Global,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&p_2.
                                 super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      psVar2 = Global::getIdentifier_abi_cxx11_(this_01);
      std::operator+(__return_storage_ptr__,"global ",psVar2);
    }
    std::shared_ptr<mocker::nasm::Global>::~shared_ptr
              ((shared_ptr<mocker::nasm::Global> *)
               &p_2.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    if (!bVar1) {
      dyc<mocker::nasm::Extern,std::shared_ptr<mocker::nasm::Directive>const&>
                ((shared_ptr<mocker::nasm::Directive> *)local_58);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
      if (bVar1) {
        this_02 = std::
                  __shared_ptr_access<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_58);
        Extern::getIdentifier_abi_cxx11_(&local_78,this_02);
        std::operator+(__return_storage_ptr__,"extern ",&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      std::shared_ptr<mocker::nasm::Extern>::~shared_ptr
                ((shared_ptr<mocker::nasm::Extern> *)local_58);
      if (!bVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/printer.cpp"
                      ,0x17,
                      "std::string mocker::nasm::fmtDirective(const std::shared_ptr<Directive> &)");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fmtDirective(const std::shared_ptr<Directive> &directive) {
  if (auto p = dyc<Default>(directive))
    return "default " + p->getMode();
  if (auto p = dyc<Global>(directive))
    return "global " + p->getIdentifier();
  if (auto p = dyc<Extern>(directive)) {
#ifdef ONLINE_JUDGE_SUPPORT
    return "";
#endif
    return "extern " + p->getIdentifier();
  }
  assert(false);
}